

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitread.c
# Opt level: O3

MPP_RET update_curbyte_h264(BitReadCtx_t *bitctx)

{
  byte bVar1;
  MPP_RET MVar2;
  RK_U32 RVar3;
  byte *pbVar4;
  long lVar5;
  
  RVar3 = bitctx->bytes_left_;
  MVar2 = MPP_ERR_READ_BIT;
  if (RVar3 != 0) {
    pbVar4 = bitctx->data_;
    lVar5 = bitctx->prev_two_bytes_;
    if ((short)lVar5 == 0 && *pbVar4 == 3) {
      pbVar4 = pbVar4 + 1;
      bitctx->data_ = pbVar4;
      bitctx->emulation_prevention_bytes_ = bitctx->emulation_prevention_bytes_ + 1;
      bitctx->used_bits = bitctx->used_bits + 8;
      lVar5 = 0xffff;
      RVar3 = RVar3 - 1;
      bitctx->bytes_left_ = RVar3;
      bitctx->prev_two_bytes_ = 0xffff;
      if (RVar3 == 0) {
        return MPP_ERR_READ_BIT;
      }
    }
    bitctx->data_ = pbVar4 + 1;
    bVar1 = *pbVar4;
    bitctx->curr_byte_ = (ulong)bVar1;
    bitctx->bytes_left_ = RVar3 - 1;
    bitctx->num_remaining_bits_in_curr_byte_ = 8;
    bitctx->prev_two_bytes_ = lVar5 << 8 | (ulong)bVar1;
    MVar2 = MPP_OK;
  }
  return MVar2;
}

Assistant:

static MPP_RET update_curbyte_h264(BitReadCtx_t *bitctx)
{
    if (bitctx->bytes_left_ < 1)
        return  MPP_ERR_READ_BIT;

    // Emulation prevention three-byte detection.
    // If a sequence of 0x000003 is found, skip (ignore) the last byte (0x03).
    if ((*bitctx->data_ == 0x03)
        && ((bitctx->prev_two_bytes_ & 0xffff) == 0)) {
        // Detected 0x000003, skip last byte.
        ++bitctx->data_;
        --bitctx->bytes_left_;
        ++bitctx->emulation_prevention_bytes_;
        bitctx->used_bits += 8;
        // Need another full three bytes before we can detect the sequence again.
        bitctx->prev_two_bytes_ = 0xffff;
        if (bitctx->bytes_left_ < 1)
            return  MPP_ERR_READ_BIT;
    }
    // Load a new byte and advance pointers.
    bitctx->curr_byte_ = *bitctx->data_++ & 0xff;
    --bitctx->bytes_left_;
    bitctx->num_remaining_bits_in_curr_byte_ = 8;
    bitctx->prev_two_bytes_ = (bitctx->prev_two_bytes_ << 8) | bitctx->curr_byte_;

    return MPP_OK;
}